

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::syntax::CaseItemSyntax*>::emplace_back<slang::syntax::CaseItemSyntax*>
          (SmallVectorBase<slang::syntax::CaseItemSyntax*> *this,CaseItemSyntax **args)

{
  iterator ppCVar1;
  CaseItemSyntax **args_local;
  SmallVectorBase<slang::syntax::CaseItemSyntax_*> *this_local;
  
  if (*(long *)(this + 8) == *(long *)(this + 0x10)) {
    ppCVar1 = SmallVectorBase<slang::syntax::CaseItemSyntax_*>::end
                        ((SmallVectorBase<slang::syntax::CaseItemSyntax_*> *)this);
    this_local = (SmallVectorBase<slang::syntax::CaseItemSyntax_*> *)
                 emplaceRealloc<slang::syntax::CaseItemSyntax*>(this,ppCVar1,args);
  }
  else {
    ppCVar1 = SmallVectorBase<slang::syntax::CaseItemSyntax_*>::end
                        ((SmallVectorBase<slang::syntax::CaseItemSyntax_*> *)this);
    *ppCVar1 = *args;
    *(long *)(this + 8) = *(long *)(this + 8) + 1;
    this_local = (SmallVectorBase<slang::syntax::CaseItemSyntax_*> *)
                 SmallVectorBase<slang::syntax::CaseItemSyntax_*>::back
                           ((SmallVectorBase<slang::syntax::CaseItemSyntax_*> *)this);
  }
  return (reference)this_local;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }